

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImDrawList *this;
  ImGuiWindow *pIVar5;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  if ((((GImGui->HoveredId == id || GImGui->HoveredId == 0) ||
       (GImGui->HoveredIdAllowOverlap == true)) &&
      (pIVar5 = GImGui->CurrentWindow, GImGui->HoveredWindow == pIVar5)) &&
     ((GImGui->ActiveId == id || GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap == true))))
  {
    bVar4 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar4) {
      uVar1 = (&pIVar3->CurrentItemFlags)[(ulong)((pIVar3->LastItemData).ID == id) * 8];
      if ((((uVar1 >> 8 & 1) == 0) && (pIVar3->NavWindow != (ImGuiWindow *)0x0)) &&
         ((pIVar2 = pIVar3->NavWindow->RootWindow, pIVar2 != (ImGuiWindow *)0x0 &&
          ((((pIVar2->WasActive == true && (pIVar5 = pIVar5->RootWindow, pIVar2 != pIVar5)) &&
            ((pIVar2->Flags & 0xc000000) != 0)) && (pIVar5->RootWindow != pIVar2)))))) {
        for (; pIVar5 != (ImGuiWindow *)0x0; pIVar5 = pIVar5->ParentWindowInBeginStack) {
          if (pIVar5 == pIVar2) goto LAB_001e970d;
        }
      }
      else {
LAB_001e970d:
        if (id != 0) {
          pIVar3->HoveredId = id;
          pIVar3->HoveredIdAllowOverlap = false;
          if (pIVar3->HoveredIdPreviousFrame != id) {
            pIVar3->HoveredIdTimer = 0.0;
            pIVar3->HoveredIdNotActiveTimer = 0.0;
          }
        }
        if ((uVar1 & 4) == 0) {
          if (((id != 0) && (pIVar3->DebugItemPickerActive == true)) &&
             (pIVar3->HoveredIdPreviousFrame == id)) {
            this = GetViewportDrawList(*(pIVar3->Viewports).Data,1,"##Foreground");
            ImDrawList::AddRect(this,&bb->Min,&bb->Max,0xff00ffff,0.0,0,1.0);
          }
          return (bool)(pIVar3->NavDisableMouseHover ^ 1);
        }
        if (pIVar3->ActiveId == id) {
          SetActiveID(0,(ImGuiWindow *)0x0);
        }
      }
      pIVar3->HoveredIdDisabled = true;
    }
  }
  return false;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;

    // Done with rectangle culling so we can perform heavier checks now.
    ImGuiItemFlags item_flags = (g.LastItemData.ID == id ? g.LastItemData.InFlags : g.CurrentItemFlags);
    if (!(item_flags & ImGuiItemFlags_NoWindowHoverableCheck) && !IsWindowContentHoverable(window, ImGuiHoveredFlags_None))
    {
        g.HoveredIdDisabled = true;
        return false;
    }

    // We exceptionally allow this function to be called with id==0 to allow using it for easy high-level
    // hover test in widgets code. We could also decide to split this function is two.
    if (id != 0)
        SetHoveredID(id);

    // When disabled we'll return false but still set HoveredId
    if (item_flags & ImGuiItemFlags_Disabled)
    {
        // Release active id if turning disabled
        if (g.ActiveId == id)
            ClearActiveID();
        g.HoveredIdDisabled = true;
        return false;
    }

    if (id != 0)
    {
        // [DEBUG] Item Picker tool!
        // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
        // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
        // items if we performed the test in ItemAdd(), but that would incur a small runtime cost.
        if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
            GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
        //if (g.DebugItemPickerBreakId == id)
        //    IM_DEBUG_BREAK();
    }

    if (g.NavDisableMouseHover)
        return false;

    return true;
}